

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::SwapFieldHelper::SwapRepeatedMessageField<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  MapFieldBase *this;
  MapFieldBase *other;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *other_00;
  SwapFieldHelper local_30 [16];
  
  if (field->type_ == '\v') {
    bVar6 = FieldDescriptor::is_map_message_type(field);
    if (bVar6) {
      Reflection::VerifyFieldType<google::protobuf::internal::MapFieldBase>(r,field);
      this = (MapFieldBase *)Reflection::MutableRawImpl(r,lhs,field);
      Reflection::VerifyFieldType<google::protobuf::internal::MapFieldBase>(r,field);
      other = (MapFieldBase *)Reflection::MutableRawImpl(r,rhs,field);
      MapFieldBase::Swap(this,other);
      return;
    }
  }
  Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
  this_00 = (RepeatedPtrFieldBase *)Reflection::MutableRawImpl(r,lhs,field);
  Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
  other_00 = (RepeatedPtrFieldBase *)Reflection::MutableRawImpl(r,rhs,field);
  if (this_00->arena_ != other_00->arena_) {
    RepeatedPtrFieldBase::
    SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              (this_00,other_00);
    return;
  }
  if (this_00 != other_00) {
    pvVar1 = this_00->tagged_rep_or_elem_;
    iVar4 = this_00->current_size_;
    iVar5 = this_00->capacity_proxy_;
    iVar2 = other_00->current_size_;
    iVar3 = other_00->capacity_proxy_;
    this_00->tagged_rep_or_elem_ = other_00->tagged_rep_or_elem_;
    this_00->current_size_ = iVar2;
    this_00->capacity_proxy_ = iVar3;
    other_00->tagged_rep_or_elem_ = pvVar1;
    other_00->current_size_ = iVar4;
    other_00->capacity_proxy_ = iVar5;
    return;
  }
  SwapRepeatedMessageField<false>(local_30);
}

Assistant:

void SwapFieldHelper::SwapRepeatedMessageField(const Reflection* r,
                                               Message* lhs, Message* rhs,
                                               const FieldDescriptor* field) {
  if (IsMapFieldInApi(field)) {
    auto* lhs_map = r->MutableRaw<MapFieldBase>(lhs, field);
    auto* rhs_map = r->MutableRaw<MapFieldBase>(rhs, field);
    if (unsafe_shallow_swap) {
      lhs_map->InternalSwap(rhs_map);
    } else {
      lhs_map->Swap(rhs_map);
    }
  } else {
    auto* lhs_rm = r->MutableRaw<RepeatedPtrFieldBase>(lhs, field);
    auto* rhs_rm = r->MutableRaw<RepeatedPtrFieldBase>(rhs, field);
    if (unsafe_shallow_swap) {
      lhs_rm->InternalSwap(rhs_rm);
    } else {
      lhs_rm->Swap<GenericTypeHandler<Message>>(rhs_rm);
    }
  }
}